

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_members_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_MembersTest_::
Typedefs<phmap::parallel_node_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Typedefs<phmap::parallel_node_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  is_same<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>
  local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_288;
  Message local_280;
  is_same<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>
  local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_240;
  Message local_238;
  is_same<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_1f8;
  Message local_1f0;
  is_same<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b0;
  Message local_1a8;
  is_same<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_168;
  Message local_160;
  is_convertible<bool,_bool> local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_120;
  Message local_118;
  is_convertible<unsigned_long,_unsigned_long> local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_d8;
  Message local_d0;
  conjunction<std::is_signed<long>,_std::is_integral<long>_> local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  conjunction<phmap::negation<std::is_signed<unsigned_long>_>,_std::is_integral<unsigned_long>_>
  local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_48 [3];
  Message local_30;
  is_same<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  Typedefs<phmap::parallel_node_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>>
            ((AssertionResult *)local_20,&local_21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)
               "(std::is_same<std::pair<const typename TypeParam::key_type, typename TypeParam::mapped_type>, typename TypeParam::value_type>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,&local_30);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  testing::AssertionResult::
  AssertionResult<phmap::conjunction<phmap::negation<std::is_signed<unsigned_long>>,std::is_integral<unsigned_long>>>
            ((AssertionResult *)local_78,&local_79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_78,
               (AssertionResult *)
               "(phmap::conjunction< phmap::negation<std::is_signed<typename TypeParam::size_type>>, std::is_integral<typename TypeParam::size_type>>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  testing::AssertionResult::
  AssertionResult<phmap::conjunction<std::is_signed<long>,std::is_integral<long>>>
            ((AssertionResult *)local_c0,&local_c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c0,
               (AssertionResult *)
               "(phmap::conjunction< std::is_signed<typename TypeParam::difference_type>, std::is_integral<typename TypeParam::difference_type>>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x35,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  testing::AssertionResult::AssertionResult<std::is_convertible<unsigned_long,unsigned_long>>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_108,
               (AssertionResult *)
               "(std::is_convertible< decltype(std::declval<const typename TypeParam::hasher&>()( std::declval<const typename TypeParam::key_type&>())), size_t>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  testing::AssertionResult::AssertionResult<std::is_convertible<bool,bool>>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_150,
               (AssertionResult *)
               "(std::is_convertible< decltype(std::declval<const typename TypeParam::key_equal&>()( std::declval<const typename TypeParam::key_type&>(), std::declval<const typename TypeParam::key_type&>())), bool>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_198,
               (AssertionResult *)
               "(std::is_same<typename TypeParam::allocator_type::value_type, typename TypeParam::value_type>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>&,std::pair<std::__cxx11::string_const,int>&>>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_1e0,
               (AssertionResult *)
               "(std::is_same<typename TypeParam::value_type&, typename TypeParam::reference>())",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>const&,std::pair<std::__cxx11::string_const,int>const&>>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_228,
               (AssertionResult *)
               "(std::is_same<const typename TypeParam::value_type&, typename TypeParam::const_reference>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>*,std::pair<std::__cxx11::string_const,int>*>>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_270,
               (AssertionResult *)
               "(std::is_same<typename std::allocator_traits< typename TypeParam::allocator_type>::pointer, typename TypeParam::pointer>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  testing::AssertionResult::
  AssertionResult<std::is_same<std::pair<std::__cxx11::string_const,int>const*,std::pair<std::__cxx11::string_const,int>const*>>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_2b8,
               (AssertionResult *)
               "(std::is_same<typename std::allocator_traits< typename TypeParam::allocator_type>::const_pointer, typename TypeParam::const_pointer>())"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_members_test.h"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  return;
}

Assistant:

TYPED_TEST_P(MembersTest, Typedefs) {
  EXPECT_TRUE((std::is_same<std::pair<const typename TypeParam::key_type,
                                      typename TypeParam::mapped_type>,
                            typename TypeParam::value_type>()));
  EXPECT_TRUE((phmap::conjunction<
               phmap::negation<std::is_signed<typename TypeParam::size_type>>,
               std::is_integral<typename TypeParam::size_type>>()));
  EXPECT_TRUE((phmap::conjunction<
               std::is_signed<typename TypeParam::difference_type>,
               std::is_integral<typename TypeParam::difference_type>>()));
  EXPECT_TRUE((std::is_convertible<
               decltype(std::declval<const typename TypeParam::hasher&>()(
                   std::declval<const typename TypeParam::key_type&>())),
               size_t>()));
  EXPECT_TRUE((std::is_convertible<
               decltype(std::declval<const typename TypeParam::key_equal&>()(
                   std::declval<const typename TypeParam::key_type&>(),
                   std::declval<const typename TypeParam::key_type&>())),
               bool>()));
  EXPECT_TRUE((std::is_same<typename TypeParam::allocator_type::value_type,
                            typename TypeParam::value_type>()));
  EXPECT_TRUE((std::is_same<typename TypeParam::value_type&,
                            typename TypeParam::reference>()));
  EXPECT_TRUE((std::is_same<const typename TypeParam::value_type&,
                            typename TypeParam::const_reference>()));
  EXPECT_TRUE((std::is_same<typename std::allocator_traits<
                                typename TypeParam::allocator_type>::pointer,
                            typename TypeParam::pointer>()));
  EXPECT_TRUE(
      (std::is_same<typename std::allocator_traits<
                        typename TypeParam::allocator_type>::const_pointer,
                    typename TypeParam::const_pointer>()));
}